

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O2

ZPOS64_T unzGetOffset64(unzFile file)

{
  long lVar1;
  
  if (((file != (unzFile)0x0) && (*(long *)((long)file + 0x90) != 0)) &&
     ((lVar1 = *(long *)((long)file + 0x68), lVar1 == 0 ||
      ((lVar1 == 0xffff || (*(long *)((long)file + 0x80) != lVar1)))))) {
    return *(ZPOS64_T *)((long)file + 0x88);
  }
  return 0;
}

Assistant:

extern ZPOS64_T ZEXPORT unzGetOffset64(unzFile file)
{
    unz64_s* s;

    if (file == NULL)
        return 0; //UNZ_PARAMERROR;
    s = (unz64_s*)file;
    if (!s->current_file_ok)
        return 0;
    if (s->gi.number_entry != 0 && s->gi.number_entry != 0xffff)
        if (s->num_file == s->gi.number_entry)
            return 0;
    return s->pos_in_central_dir;
}